

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

int __thiscall
rr::SingleSampleLineRasterizer::init(SingleSampleLineRasterizer *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int i;
  int iVar2;
  long lVar3;
  int i_2;
  long lVar4;
  int iVar5;
  float *in_RDX;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  float in_XMM0_Da;
  float fVar14;
  Vector<long,_2> widthOffset;
  Vector<float,_4> res_1;
  long local_78 [2];
  undefined8 local_68;
  long lStack_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_78[0] = 0;
  local_78[1] = 0;
  lVar3 = 0;
  do {
    *(float *)((long)local_78 + lVar3 * 4) = in_RDX[lVar3] - *(float *)(ctx + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_68 = 0;
  lStack_60 = 0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_68 + lVar3 * 4) = in_RDX[lVar3] - *(float *)(ctx + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_48 = (float)(~-(uint)((float)local_78[0] < 0.0) & (uint)(float)local_78[0] |
                    (uint)-(float)local_78[0] & -(uint)((float)local_78[0] < 0.0));
  local_58 = -local_68._4_4_;
  if (local_58 <= local_68._4_4_) {
    local_58 = local_68._4_4_;
  }
  iVar2 = 1;
  if (1.0 < in_XMM0_Da) {
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    uStack_54 = 0x80000000;
    uStack_50 = 0x80000000;
    uStack_4c = 0x80000000;
    fVar14 = floorf(in_XMM0_Da + 0.5);
    iVar2 = (int)fVar14;
  }
  lVar3 = 0;
  local_68 = -(ulong)(local_48 < local_58);
  lStack_60 = (ulong)(local_48 < local_58) - 1;
  local_78[0] = 0;
  local_78[1] = 0;
  do {
    local_78[lVar3] = (&local_68)[lVar3] * (long)(iVar2 * 0x100 + -0x100 >> 1);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  uVar12 = -(uint)(*(float *)ctx < 0.0);
  lVar4 = (long)(*(float *)ctx * 256.0 + (float)(~uVar12 & 0x3f000000 | uVar12 & 0xbf000000)) +
          local_78[0];
  uVar12 = -(uint)(*(float *)(ctx + 4) < 0.0);
  lVar7 = (long)(*(float *)(ctx + 4) * 256.0 + (float)(~uVar12 & 0x3f000000 | uVar12 & 0xbf000000))
          + local_78[1];
  uVar12 = -(uint)(*in_RDX < 0.0);
  uVar13 = -(uint)(in_RDX[1] < 0.0);
  local_78[0] = (long)(*in_RDX * 256.0 + (float)(~uVar12 & 0x3f000000 | uVar12 & 0xbf000000)) +
                local_78[0];
  local_78[1] = (long)(in_RDX[1] * 256.0 + (float)(~uVar13 & 0x3f000000 | uVar13 & 0xbf000000)) +
                local_78[1];
  lVar3 = local_78[0];
  if (lVar4 < local_78[0]) {
    lVar3 = lVar4;
  }
  if (local_78[0] < lVar4) {
    local_78[0] = lVar4;
  }
  lVar3 = lVar3 + -0x100;
  lVar4 = local_78[1];
  if (lVar7 < local_78[1]) {
    lVar4 = lVar7;
  }
  if (local_78[1] < lVar7) {
    local_78[1] = lVar7;
  }
  lVar4 = lVar4 + -0x100;
  lVar7 = 0xffffffff00;
  if (local_48 < local_58) {
    lVar11 = 0xffffffff00;
    if (-1 < lVar4) {
      lVar11 = -1;
    }
    iVar9 = (this->m_viewport).m_data[1];
    iVar8 = iVar9 + (this->m_viewport).m_data[3] + -1;
    iVar10 = (int)((ulong)(lVar11 + lVar4) >> 8);
    iVar6 = iVar8;
    if (iVar10 < iVar8) {
      iVar6 = iVar10;
    }
    if (iVar10 < iVar9) {
      iVar6 = iVar9;
    }
    iVar10 = (int)((ulong)(local_78[1] + 0x200) >> 8);
    if (local_78[1] + 0x100 < 0) {
      iVar10 = (int)((ulong)(local_78[1] + 0x101) >> 8);
    }
    if (iVar10 < iVar8) {
      iVar8 = iVar10;
    }
    iVar5 = (this->m_viewport).m_data[0];
    if (iVar10 < iVar9) {
      iVar8 = iVar9;
    }
    (this->m_bboxMin).m_data[1] = iVar6;
    if (-1 < lVar3) {
      lVar7 = -1;
    }
    (this->m_bboxMax).m_data[1] = iVar8;
    iVar9 = (this->m_viewport).m_data[2] + iVar5 + -1;
    iVar5 = iVar5 - iVar2;
    iVar6 = (int)((ulong)(lVar7 + lVar3) >> 8);
    iVar2 = iVar9;
    if (iVar6 < iVar9) {
      iVar2 = iVar6;
    }
    if (iVar6 < iVar5) {
      iVar2 = iVar5;
    }
    (this->m_bboxMin).m_data[0] = iVar2;
    iVar2 = (int)((ulong)(local_78[0] + 0x101) >> 8);
    if (-1 < local_78[0] + 0x100) {
      iVar2 = (int)((ulong)(local_78[0] + 0x200) >> 8);
    }
    if (iVar2 < iVar9) {
      iVar9 = iVar2;
    }
    if (iVar2 < iVar5) {
      iVar9 = iVar5;
    }
    (this->m_bboxMax).m_data[0] = iVar9;
  }
  else {
    lVar11 = 0xffffffff00;
    if (-1 < lVar3) {
      lVar11 = -1;
    }
    iVar9 = (this->m_viewport).m_data[0];
    iVar8 = (this->m_viewport).m_data[2] + iVar9 + -1;
    iVar10 = (int)((ulong)(lVar11 + lVar3) >> 8);
    iVar6 = iVar8;
    if (iVar10 < iVar8) {
      iVar6 = iVar10;
    }
    if (iVar10 < iVar9) {
      iVar6 = iVar9;
    }
    iVar10 = (int)((ulong)(local_78[0] + 0x200) >> 8);
    if (local_78[0] + 0x100 < 0) {
      iVar10 = (int)((ulong)(local_78[0] + 0x101) >> 8);
    }
    if (iVar10 < iVar8) {
      iVar8 = iVar10;
    }
    iVar5 = (this->m_viewport).m_data[1];
    if (iVar10 < iVar9) {
      iVar8 = iVar9;
    }
    (this->m_bboxMin).m_data[0] = iVar6;
    if (-1 < lVar4) {
      lVar7 = -1;
    }
    (this->m_bboxMax).m_data[0] = iVar8;
    iVar9 = (this->m_viewport).m_data[3] + iVar5 + -1;
    iVar5 = iVar5 - iVar2;
    iVar6 = (int)((ulong)(lVar7 + lVar4) >> 8);
    iVar2 = iVar9;
    if (iVar6 < iVar9) {
      iVar2 = iVar6;
    }
    if (iVar6 < iVar5) {
      iVar2 = iVar5;
    }
    (this->m_bboxMin).m_data[1] = iVar2;
    iVar2 = (int)((ulong)(local_78[1] + 0x101) >> 8);
    if (-1 < local_78[1] + 0x100) {
      iVar2 = (int)((ulong)(local_78[1] + 0x200) >> 8);
    }
    if (iVar2 < iVar9) {
      iVar9 = iVar2;
    }
    if (iVar2 < iVar5) {
      iVar9 = iVar5;
    }
    (this->m_bboxMax).m_data[1] = iVar9;
  }
  this->m_lineWidth = in_XMM0_Da;
  uVar1 = *(undefined8 *)(ctx + 8);
  *(undefined8 *)(this->m_v0).m_data = *(undefined8 *)ctx;
  *(undefined8 *)((this->m_v0).m_data + 2) = uVar1;
  uVar1 = *(undefined8 *)(in_RDX + 2);
  *(undefined8 *)(this->m_v1).m_data = *(undefined8 *)in_RDX;
  *(undefined8 *)((this->m_v1).m_data + 2) = uVar1;
  uVar1 = *(undefined8 *)(this->m_bboxMin).m_data;
  *(undefined8 *)(this->m_curPos).m_data = uVar1;
  this->m_curRowFragment = 0;
  return (int)uVar1;
}

Assistant:

void SingleSampleLineRasterizer::init (const tcu::Vec4& v0, const tcu::Vec4& v1, float lineWidth)
{
	const bool						isXMajor		= de::abs((v1 - v0).x()) >= de::abs((v1 - v0).y());

	// Bounding box \note: with wide lines, the line is actually moved as in the spec
	const deInt32					lineWidthPixels	= (lineWidth > 1.0f) ? (deInt32)floor(lineWidth + 0.5f) : 1;

	const tcu::Vector<deInt64,2>	widthOffset		= (isXMajor ? tcu::Vector<deInt64,2>(0, -1) : tcu::Vector<deInt64,2>(-1, 0)) * (toSubpixelCoord(lineWidthPixels - 1) / 2);

	const deInt64					x0				= toSubpixelCoord(v0.x()) + widthOffset.x();
	const deInt64					y0				= toSubpixelCoord(v0.y()) + widthOffset.y();
	const deInt64					x1				= toSubpixelCoord(v1.x()) + widthOffset.x();
	const deInt64					y1				= toSubpixelCoord(v1.y()) + widthOffset.y();

	// line endpoints might be perturbed, add some margin
	const deInt64					xMin			= de::min(x0, x1) - toSubpixelCoord(1);
	const deInt64					xMax			= de::max(x0, x1) + toSubpixelCoord(1);
	const deInt64					yMin			= de::min(y0, y1) - toSubpixelCoord(1);
	const deInt64					yMax			= de::max(y0, y1) + toSubpixelCoord(1);

	// Remove invisible area

	if (isXMajor)
	{
		// clamp to viewport in major direction
		m_bboxMin.x() = de::clamp(floorSubpixelToPixelCoord(xMin, true), m_viewport.x(), m_viewport.x() + m_viewport.z() - 1);
		m_bboxMax.x() = de::clamp(ceilSubpixelToPixelCoord (xMax, true), m_viewport.x(), m_viewport.x() + m_viewport.z() - 1);

		// clamp to padded viewport in minor direction (wide lines might bleed over viewport in minor direction)
		m_bboxMin.y() = de::clamp(floorSubpixelToPixelCoord(yMin, true), m_viewport.y() - lineWidthPixels, m_viewport.y() + m_viewport.w() - 1);
		m_bboxMax.y() = de::clamp(ceilSubpixelToPixelCoord (yMax, true), m_viewport.y() - lineWidthPixels, m_viewport.y() + m_viewport.w() - 1);
	}
	else
	{
		// clamp to viewport in major direction
		m_bboxMin.y() = de::clamp(floorSubpixelToPixelCoord(yMin, true), m_viewport.y(), m_viewport.y() + m_viewport.w() - 1);
		m_bboxMax.y() = de::clamp(ceilSubpixelToPixelCoord (yMax, true), m_viewport.y(), m_viewport.y() + m_viewport.w() - 1);

		// clamp to padded viewport in minor direction (wide lines might bleed over viewport in minor direction)
		m_bboxMin.x() = de::clamp(floorSubpixelToPixelCoord(xMin, true), m_viewport.x() - lineWidthPixels, m_viewport.x() + m_viewport.z() - 1);
		m_bboxMax.x() = de::clamp(ceilSubpixelToPixelCoord (xMax, true), m_viewport.x() - lineWidthPixels, m_viewport.x() + m_viewport.z() - 1);
	}

	m_lineWidth = lineWidth;

	m_v0 = v0;
	m_v1 = v1;

	m_curPos = m_bboxMin;
	m_curRowFragment = 0;
}